

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.cpp
# Opt level: O0

void * uprv_realloc_63(void *buffer,size_t size)

{
  size_t size_local;
  void *buffer_local;
  
  if ((int32_t *)buffer == zeroMem) {
    buffer_local = uprv_malloc_63(size);
  }
  else if (size == 0) {
    if (pFree == (UMemFreeFn *)0x0) {
      free(buffer);
    }
    else {
      (*pFree)(pContext,buffer);
    }
    buffer_local = zeroMem;
  }
  else if (pRealloc == (UMemReallocFn *)0x0) {
    buffer_local = realloc(buffer,size);
  }
  else {
    buffer_local = (*pRealloc)(pContext,buffer,size);
  }
  return buffer_local;
}

Assistant:

U_CAPI void * U_EXPORT2
uprv_realloc(void * buffer, size_t size) {
#if U_DEBUG && defined(UPRV_MALLOC_COUNT)
  putchar('~');
  fflush(stdout);
#endif
    if (buffer == zeroMem) {
        return uprv_malloc(size);
    } else if (size == 0) {
        if (pFree) {
            (*pFree)(pContext, buffer);
        } else {
            uprv_default_free(buffer);
        }
        return (void *)zeroMem;
    } else {
        if (pRealloc) {
            return (*pRealloc)(pContext, buffer, size);
        } else {
            return uprv_default_realloc(buffer, size);
        }
    }
}